

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# livevar_analyse.hpp
# Opt level: O2

void __thiscall optimization::livevar_analyse::Livevar_Analyse::unroll_phi(Livevar_Analyse *this)

{
  MirFunction *pMVar1;
  Inst *pIVar2;
  Livevar_Analyse *pLVar3;
  int iVar4;
  ostream *poVar5;
  reference pvVar6;
  mapped_type *__k;
  mapped_type *pmVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  Tag *in_RSI;
  Function *function;
  ulong __n;
  pair<std::_Rb_tree_iterator<mir::inst::VarId>,_bool> pVar10;
  VarId var;
  Var_Replace vp;
  allocator<char> local_143;
  allocator<char> local_142;
  ostream local_141;
  Livevar_Analyse *local_140;
  _Rb_tree_node_base *local_138;
  string local_130;
  _Base_ptr local_110;
  _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
  *local_108;
  VarId local_100;
  undefined1 local_f0;
  undefined1 local_e8 [40];
  undefined1 local_c0 [40];
  Var_Replace local_98;
  
  local_141 = (ostream)0x0;
  local_140 = this;
  AixLog::operator<<(&local_141,(Severity *)in_RSI);
  AixLog::Tag::Tag((Tag *)(local_e8 + 0x20));
  AixLog::operator<<((ostream *)(local_e8 + 0x20),in_RSI);
  local_100._8_8_ = std::chrono::_V2::system_clock::now();
  local_100.super_Displayable._vptr_Displayable = (_func_int **)&PTR__Timestamp_001d8f28;
  local_f0 = 0;
  AixLog::operator<<((ostream *)&local_100,(Timestamp *)in_RSI);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_e8,"unroll_phi",&local_142);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/livevar_analyse.hpp"
             ,&local_143);
  function = (Function *)local_e8;
  AixLog::Function::Function((Function *)&local_98,(string *)function,&local_130,0xf2);
  AixLog::operator<<((ostream *)&local_98,function);
  poVar5 = std::operator<<((ostream *)&std::clog," is unrolling phi for ");
  poVar5 = std::operator<<(poVar5,(string *)&local_140->func->name);
  std::endl<char,std::char_traits<char>>(poVar5);
  AixLog::Function::~Function((Function *)&local_98);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)local_e8);
  AixLog::Tag::~Tag((Tag *)(local_e8 + 0x20));
  pLVar3 = local_140;
  var_replace::Var_Replace::Var_Replace(&local_98,local_140->func);
  pMVar1 = pLVar3->func;
  local_110 = &(pMVar1->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_108 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
               *)&pLVar3->phi_dests;
  p_Var9 = (pMVar1->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var9 != local_110) {
    local_138 = p_Var9;
    for (__n = 0; __n < (ulong)((long)local_138[3]._M_left - (long)local_138[3]._M_parent >> 3);
        __n = __n + 1) {
      pvVar6 = std::
               vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ::at((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                     *)&p_Var9[3]._M_parent,__n);
      iVar4 = (*(((pvVar6->_M_t).
                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t
                  .super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
                _vptr_Displayable[1])();
      if (iVar4 == 7) {
        pVar10 = std::
                 _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                 ::_M_insert_unique<mir::inst::VarId_const&>
                           (local_108,
                            &((pvVar6->_M_t).
                              super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                              .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest);
        pIVar2 = (pvVar6->_M_t).
                 super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                 super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                 super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
        (*(pIVar2->super_Displayable)._vptr_Displayable[2])(local_e8 + 0x20,pIVar2,pVar10._8_8_);
        for (p_Var8 = (_Rb_tree_node_base *)local_c0._16_8_;
            p_Var8 != (_Rb_tree_node_base *)local_c0;
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          local_e8._0_8_ = &PTR_display_001d90d0;
          local_e8._8_4_ = *(undefined4 *)&p_Var8[1]._M_parent;
          pMVar1 = local_140->func;
          __k = std::
                map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                ::at(&local_98.defpoint,(key_type *)local_e8);
          pmVar7 = std::
                   map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                   ::at(&pMVar1->basic_blks,&__k->first);
          pvVar6 = std::
                   vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   ::at((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                         *)&p_Var9[3]._M_parent,__n);
          std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::VarId&>
                    (&local_100,
                     &((pvVar6->_M_t).
                       super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                       .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest);
          local_130._M_dataplus._M_p = (pointer)local_100.super_Displayable._vptr_Displayable;
          local_100.super_Displayable._vptr_Displayable = (_func_int **)0x0;
          std::
          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
          ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                    ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                      *)&pmVar7->inst,
                     (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     &local_130);
          if ((_func_int **)local_130._M_dataplus._M_p != (_func_int **)0x0) {
            (**(code **)(*(_func_int **)local_130._M_dataplus._M_p + 0x28))();
          }
          local_130._M_dataplus._M_p = (pointer)0x0;
          std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
          ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                       *)&local_100);
        }
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                     *)(local_e8 + 0x20));
      }
    }
    p_Var9 = (_Base_ptr)std::_Rb_tree_increment(local_138);
  }
  var_replace::Var_Replace::~Var_Replace(&local_98);
  return;
}

Assistant:

void unroll_phi() {
    LOG(TRACE) << " is unrolling phi for " << func.name << std::endl;
    var_replace::Var_Replace vp(func);
    for (auto& blkpair : func.basic_blks) {
      for (auto i = 0; i < blkpair.second.inst.size(); ++i) {
        auto& inst = blkpair.second.inst.at(i);
        if (inst->inst_kind() == mir::inst::InstKind::Phi) {
          phi_dests.insert(inst->dest);
          for (auto var : inst->useVars()) {
            func.basic_blks.at(vp.defpoint.at(var).first)
                .inst.push_back(std::make_unique<mir::inst::AssignInst>(
                    blkpair.second.inst.at(i)->dest, var));
          }
        }
      }
    }
    // LOG(TRACE) << func << std::endl;
  }